

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O1

llama_kv_cache_view *
llama_kv_cache_view_init
          (llama_kv_cache_view *__return_storage_ptr__,llama_kv_cache *kv,int32_t n_seq_max)

{
  int iVar1;
  
  __return_storage_ptr__->n_cells = 0;
  __return_storage_ptr__->n_seq_max = n_seq_max;
  __return_storage_ptr__->token_count = 0;
  iVar1 = (*(kv->super_llama_memory_i)._vptr_llama_memory_i[0xc])(kv);
  __return_storage_ptr__->used_cells = iVar1;
  __return_storage_ptr__->max_contiguous = 0;
  __return_storage_ptr__->max_contiguous_idx = -1;
  __return_storage_ptr__->cells = (llama_kv_cache_view_cell *)0x0;
  __return_storage_ptr__->cells_sequences = (llama_seq_id *)0x0;
  return __return_storage_ptr__;
}

Assistant:

llama_kv_cache_view llama_kv_cache_view_init(const llama_kv_cache & kv, int32_t n_seq_max) {
    llama_kv_cache_view result = {
        /*.n_cells            = */ 0,
        /*.n_seq_max          = */ n_seq_max,
        /*.token_count        = */ 0,
        /*.used_cells         = */ kv.get_used_cells(),
        /*.max_contiguous     = */ 0,
        /*.max_contiguous_idx = */ -1,
        /*.cells              = */ nullptr,
        /*.cells_sequences    = */ nullptr,
    };

    return result;
}